

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall ClipperLib::Clipper::IsTopHorz(Clipper *this,long64 XPos)

{
  TEdge *pTVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  TEdge **ppTVar5;
  
  ppTVar5 = &this->m_SortedEdges;
  do {
    pTVar1 = *ppTVar5;
    if (pTVar1 == (TEdge *)0x0) break;
    lVar2 = pTVar1->xcurr;
    lVar3 = pTVar1->xtop;
    lVar4 = lVar3;
    if (lVar3 < lVar2) {
      lVar4 = lVar2;
      lVar2 = lVar3;
    }
    ppTVar5 = &pTVar1->nextInSEL;
  } while ((XPos < lVar2) || (lVar4 < XPos));
  return pTVar1 == (TEdge *)0x0;
}

Assistant:

bool Clipper::IsTopHorz(const long64 XPos)
{
  TEdge* e = m_SortedEdges;
  while( e )
  {
    if(  ( XPos >= std::min(e->xcurr, e->xtop) ) &&
      ( XPos <= std::max(e->xcurr, e->xtop) ) ) return false;
    e = e->nextInSEL;
  }
  return true;
}